

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-chat.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  void *pvVar2;
  pointer plVar3;
  undefined1 *puVar4;
  char *pcVar5;
  byte bVar6;
  undefined1 uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  llama_chat_message *msg;
  llama_chat_message *plVar18;
  char *__endptr;
  allocator<char> *paVar19;
  int *piVar20;
  byte bVar21;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> messages;
  llama_token new_token_id;
  vector<char,_std::allocator<char>_> formatted;
  string response;
  string prompt;
  string user;
  vector<int,_std::allocator<int>_> prompt_tokens;
  string model_path;
  string piece;
  llama_batch batch;
  char buf [256];
  llama_model_params model_params;
  llama_context_params ctx_params;
  int local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined8 local_3c8;
  int local_37c;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> local_378;
  long local_358;
  char **local_350;
  undefined8 local_348;
  undefined4 local_33c;
  vector<char,_std::allocator<char>_> local_338;
  char *local_320;
  undefined8 local_318;
  char local_310;
  undefined7 uStack_30f;
  long *local_300;
  undefined4 local_2f8;
  long local_2f0 [2];
  char *local_2e0;
  long local_2d8;
  char local_2d0;
  undefined7 uStack_2cf;
  vector<int,_std::allocator<int>_> local_2c0;
  undefined1 *local_2a8;
  char *local_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  long *local_288 [2];
  long local_278 [2];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  llama_chat_message local_228;
  long local_218 [30];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  allocator<char> local_f0 [16];
  undefined4 local_e0;
  undefined8 local_a8;
  
  bVar21 = 0;
  local_2a8 = &local_298;
  local_2a0 = (char *)0x0;
  local_298 = 0;
  bVar6 = 1 < argc;
  if (argc < 2) {
    iVar17 = 0;
    local_358 = CONCAT44(local_358._4_4_,99);
    iVar9 = 0x800;
    __endptr = (char *)argv;
  }
  else {
    iVar17 = 1;
    local_37c = 0x800;
    local_358 = CONCAT44(local_358._4_4_,99);
    local_350 = argv;
    do {
      local_348 = CONCAT71(local_348._1_7_,bVar6);
      pcVar1 = argv[iVar17];
      __endptr = "-m";
      iVar9 = strcmp(pcVar1,"-m");
      pcVar5 = local_2a0;
      if (iVar9 == 0) {
        if (argc <= iVar17 + 1) goto LAB_001028b5;
        pcVar1 = argv[iVar17 + 1];
        strlen(pcVar1);
        __endptr = (char *)0x0;
        std::__cxx11::string::_M_replace((ulong)&local_2a8,0,pcVar5,(ulong)pcVar1);
      }
      else {
        __endptr = "-c";
        iVar9 = strcmp(pcVar1,"-c");
        if (iVar9 == 0) {
          if (argc <= iVar17 + 1) goto LAB_001028b5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,argv[iVar17 + 1],local_f0);
          pcVar1 = local_228.role;
          piVar11 = __errno_location();
          iVar9 = *piVar11;
          *piVar11 = 0;
          __endptr = (char *)&local_a8;
          lVar12 = strtol(pcVar1,(char **)__endptr,10);
          if ((long *)CONCAT44(local_a8._4_4_,(int)local_a8) == (long *)pcVar1) goto LAB_0010313e;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_00103132;
          if (*piVar11 == 0) {
            *piVar11 = iVar9;
          }
          if ((long *)local_228.role != local_218) {
            __endptr = (char *)(local_218[0] + 1);
            operator_delete(local_228.role,(ulong)__endptr);
          }
          local_37c = (int)lVar12;
          argv = local_350;
        }
        else {
          __endptr = "-ngl";
          iVar9 = strcmp(pcVar1,"-ngl");
          if ((iVar9 != 0) || (argc <= iVar17 + 1)) {
LAB_001028b5:
            print_usage((int)argv,(char **)__endptr);
            iVar17 = 1;
            bVar6 = (byte)local_348;
            iVar9 = local_37c;
            goto LAB_001028cd;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,argv[iVar17 + 1],local_f0);
          pcVar1 = local_228.role;
          piVar11 = __errno_location();
          iVar9 = *piVar11;
          *piVar11 = 0;
          __endptr = (char *)&local_a8;
          lVar12 = strtol(pcVar1,(char **)__endptr,10);
          if ((long *)CONCAT44(local_a8._4_4_,(int)local_a8) == (long *)pcVar1) goto LAB_00103126;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0010311a;
          if (*piVar11 == 0) {
            *piVar11 = iVar9;
          }
          if ((long *)local_228.role != local_218) {
            __endptr = (char *)(local_218[0] + 1);
            operator_delete(local_228.role,(ulong)__endptr);
          }
          local_358 = CONCAT44(local_358._4_4_,(int)lVar12);
          argv = local_350;
        }
      }
      iVar17 = iVar17 + 2;
      bVar6 = iVar17 < argc;
    } while (iVar17 < argc);
    iVar17 = 0;
    iVar9 = local_37c;
  }
LAB_001028cd:
  if ((bVar6 & 1) == 0) {
    if (local_2a0 == (char *)0x0) {
      print_usage((int)argv,(char **)__endptr);
    }
    else {
      llama_log_set(main::anon_class_1_0_00000001::__invoke,0);
      ggml_backend_load_all();
      llama_model_default_params(local_f0);
      puVar4 = local_2a8;
      local_e0 = (undefined4)local_358;
      paVar19 = local_f0;
      piVar11 = &local_3f8;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined8 *)piVar11 = *(undefined8 *)paVar19;
        paVar19 = paVar19 + ((ulong)bVar21 * -2 + 1) * 8;
        piVar11 = (int *)((long)piVar11 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      lVar12 = llama_model_load_from_file(puVar4);
      if (lVar12 == 0) {
        main_cold_5();
      }
      else {
        uVar13 = llama_model_get_vocab(lVar12);
        llama_context_default_params(&local_a8);
        local_a8._0_4_ = iVar9;
        local_a8._4_4_ = iVar9;
        piVar11 = (int *)&local_a8;
        piVar20 = &local_3f8;
        for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
          *(undefined8 *)piVar20 = *(undefined8 *)piVar11;
          piVar11 = piVar11 + ((ulong)bVar21 * -2 + 1) * 2;
          piVar20 = (int *)((long)piVar20 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        lVar16 = llama_init_from_model(lVar12);
        if (lVar16 != 0) {
          uVar7 = llama_sampler_chain_default_params();
          uVar14 = llama_sampler_chain_init(uVar7);
          uVar15 = llama_sampler_init_min_p(0x3d4ccccd,1);
          llama_sampler_chain_add(uVar14,uVar15);
          uVar15 = llama_sampler_init_temp(0x3f4ccccd);
          llama_sampler_chain_add(uVar14,uVar15);
          uVar15 = llama_sampler_init_dist(0xffffffff);
          llama_sampler_chain_add(uVar14,uVar15);
          local_378.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
          _M_impl.super__Vector_impl_data._M_start = (llama_chat_message *)0x0;
          local_378.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
          _M_impl.super__Vector_impl_data._M_finish = (llama_chat_message *)0x0;
          local_378.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (llama_chat_message *)0x0;
          uVar10 = llama_n_ctx(lVar16);
          local_37c = iVar17;
          local_358 = lVar12;
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_338,(ulong)uVar10,(allocator_type *)&local_228);
          local_350 = (char **)((ulong)local_350 & 0xffffffff00000000);
          do {
            printf("\x1b[32m> \x1b[0m");
            local_2e0 = &local_2d0;
            local_2d8 = 0;
            local_2d0 = '\0';
            cVar8 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18));
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_2e0,cVar8);
            if (local_2d8 == 0) {
              cVar8 = '\x06';
            }
            else {
              local_348 = llama_model_chat_template(local_358,0);
              local_228.role = "user";
              local_228.content = strdup(local_2e0);
              if (local_378.
                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_378.
                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                _M_realloc_insert<llama_chat_message>
                          (&local_378,
                           (iterator)
                           local_378.
                           super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_228);
              }
              else {
                local_228.content._4_4_ = (undefined4)((ulong)local_228.content >> 0x20);
                *(undefined4 *)
                 &(local_378.
                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->role = local_228.role._0_4_;
                *(undefined4 *)
                 ((long)&(local_378.
                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->role + 4) =
                     local_228.role._4_4_;
                *(undefined4 *)
                 &(local_378.
                   super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->content = local_228.content._0_4_;
                *(undefined4 *)
                 ((long)&(local_378.
                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->content + 4) =
                     local_228.content._4_4_;
                local_378.
                super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_378.
                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar10 = llama_chat_apply_template
                                 (local_348,
                                  local_378.
                                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_378.
                                        super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_378.
                                        super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4,1,
                                  CONCAT44(local_338.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)local_338.
                                                super__Vector_base<char,_std::allocator<char>_>.
                                                _M_impl.super__Vector_impl_data._M_start),
                                  (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                  (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
              if ((int)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                  (int)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start < (int)uVar10) {
                std::vector<char,_std::allocator<char>_>::resize(&local_338,(long)(int)uVar10);
                uVar10 = llama_chat_apply_template
                                   (local_348,
                                    local_378.
                                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4,1,
                                    CONCAT44(local_338.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start._4_4_,
                                             (int)local_338.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                    (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                    (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
              }
              if ((int)uVar10 < 0) {
                main_cold_3();
                cVar8 = '\x01';
                local_37c = 1;
              }
              else {
                local_300 = local_2f0;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((string *)&local_300,
                           (long)(int)local_350 +
                           CONCAT44(local_338.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start),
                           (ulong)uVar10 +
                           CONCAT44(local_338.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start));
                printf("\x1b[33m");
                local_320 = &local_310;
                local_318 = 0;
                local_310 = '\0';
                iVar17 = llama_kv_self_used_cells(lVar16);
                local_3f8 = 1;
                iVar9 = llama_tokenize(uVar13,local_300,local_2f8,0,0,iVar17 == 0);
                std::vector<int,_std::allocator<int>_>::vector
                          (&local_2c0,(long)-iVar9,(allocator_type *)&local_228);
                local_3f8 = 1;
                iVar17 = llama_tokenize(uVar13,local_300,local_2f8,
                                        local_2c0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)local_2c0.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_2c0.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2,
                                        iVar17 == 0);
                if (iVar17 < 0) {
LAB_00103100:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                             ,0x6b,"failed to tokenize the prompt\n");
LAB_0010311a:
                  std::__throw_out_of_range("stoi");
LAB_00103126:
                  std::__throw_invalid_argument("stoi");
LAB_00103132:
                  std::__throw_out_of_range("stoi");
LAB_0010313e:
                  uVar13 = std::__throw_invalid_argument("stoi");
                  if (local_378.
                      super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                      _M_impl.super__Vector_impl_data._M_start != (llama_chat_message *)0x0) {
                    operator_delete(local_378.
                                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_2a8 != &local_298) {
                    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
                  }
                  _Unwind_Resume(uVar13);
                }
                llama_batch_get_one(&local_268,
                                    local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (ulong)((long)local_2c0.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_2c0.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
LAB_00102cde:
                iVar17 = llama_n_ctx(lVar16);
                iVar9 = llama_kv_self_used_cells(lVar16);
                if (iVar17 < iVar9 + (int)local_268) {
                  main_cold_2();
LAB_001030cc:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                             ,0x7c,"failed to decode\n");
LAB_001030e6:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/simple-chat/simple-chat.cpp"
                             ,0x8b,"failed to convert token to piece\n");
                  goto LAB_00103100;
                }
                local_3c8 = local_238;
                local_3d8 = (undefined4)local_248;
                uStack_3d4 = local_248._4_4_;
                uStack_3d0 = (undefined4)uStack_240;
                uStack_3cc = uStack_240._4_4_;
                local_3e8 = (undefined4)local_258;
                uStack_3e4 = local_258._4_4_;
                uStack_3e0 = (undefined4)uStack_250;
                uStack_3dc = uStack_250._4_4_;
                local_3f8 = (int)local_268;
                uStack_3f4 = local_268._4_4_;
                uStack_3f0 = (undefined4)uStack_260;
                uStack_3ec = uStack_260._4_4_;
                iVar17 = llama_decode(lVar16);
                if (iVar17 != 0) goto LAB_001030cc;
                local_33c = llama_sampler_sample(uVar14,lVar16,0xffffffff);
                cVar8 = llama_vocab_is_eog(uVar13,local_33c);
                if (cVar8 == '\0') {
                  uVar10 = llama_token_to_piece(uVar13,local_33c,&local_228,0x100,0,1);
                  if ((int)uVar10 < 0) goto LAB_001030e6;
                  local_288[0] = local_278;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,&local_228,(long)&local_228.role + (ulong)uVar10);
                  printf("%s",local_288[0]);
                  fflush(_stdout);
                  std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_288[0]);
                  llama_batch_get_one(&local_128,&local_33c,1);
                  local_238 = local_f8;
                  local_248 = local_108;
                  uStack_240 = uStack_100;
                  local_258 = local_118;
                  uStack_250 = uStack_110;
                  local_268 = local_128;
                  uStack_260 = uStack_120;
                  if (local_288[0] != local_278) {
                    operator_delete(local_288[0],local_278[0] + 1);
                  }
                  goto LAB_00102cde;
                }
                if (local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_2c0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_2c0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                printf("\n\x1b[0m");
                local_228.role = "assistant";
                local_228.content = strdup(local_320);
                if (local_378.
                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_378.
                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                  _M_realloc_insert<llama_chat_message>
                            (&local_378,
                             (iterator)
                             local_378.
                             super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_228);
                }
                else {
                  local_228.content._4_4_ = (undefined4)((ulong)local_228.content >> 0x20);
                  *(undefined4 *)
                   &(local_378.
                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->role = local_228.role._0_4_;
                  *(undefined4 *)
                   ((long)&(local_378.
                            super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->role + 4) =
                       local_228.role._4_4_;
                  *(undefined4 *)
                   &(local_378.
                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->content = local_228.content._0_4_;
                  *(undefined4 *)
                   ((long)&(local_378.
                            super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->content + 4) =
                       local_228.content._4_4_;
                  local_378.
                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_378.
                       super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                iVar17 = llama_chat_apply_template
                                   (local_348,
                                    local_378.
                                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_378.
                                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4,0,0,0);
                local_350 = (char **)CONCAT44(local_350._4_4_,iVar17);
                cVar8 = iVar17 < 0;
                if ((bool)cVar8) {
                  main_cold_1();
                  local_37c = 1;
                }
                if (local_320 != &local_310) {
                  operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
                }
                if (local_300 != local_2f0) {
                  operator_delete(local_300,local_2f0[0] + 1);
                }
              }
            }
            if (local_2e0 != &local_2d0) {
              operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
            }
            plVar3 = local_378.
                     super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          } while (cVar8 == '\0');
          plVar18 = local_378.
                    super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar17 = local_37c;
          if (cVar8 == '\x06') {
            for (; plVar18 != plVar3; plVar18 = plVar18 + 1) {
              free(plVar18->content);
            }
            llama_sampler_free(uVar14);
            llama_free(lVar16);
            llama_model_free(local_358);
            iVar17 = 0;
          }
          pvVar2 = (void *)CONCAT44(local_338.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)local_338.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar2);
          }
          if (local_378.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
              _M_impl.super__Vector_impl_data._M_start != (llama_chat_message *)0x0) {
            operator_delete(local_378.
                            super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_378.
                                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_378.
                                  super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_0010307a;
        }
        main_cold_4();
      }
    }
    iVar17 = 1;
  }
LAB_0010307a:
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  return iVar17;
}

Assistant:

int main(int argc, char ** argv) {
    std::string model_path;
    int ngl = 99;
    int n_ctx = 2048;

    // parse command line arguments
    for (int i = 1; i < argc; i++) {
        try {
            if (strcmp(argv[i], "-m") == 0) {
                if (i + 1 < argc) {
                    model_path = argv[++i];
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-c") == 0) {
                if (i + 1 < argc) {
                    n_ctx = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-ngl") == 0) {
                if (i + 1 < argc) {
                    ngl = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else {
                print_usage(argc, argv);
                return 1;
            }
        } catch (std::exception & e) {
            fprintf(stderr, "error: %s\n", e.what());
            print_usage(argc, argv);
            return 1;
        }
    }
    if (model_path.empty()) {
        print_usage(argc, argv);
        return 1;
    }

    // only print errors
    llama_log_set([](enum ggml_log_level level, const char * text, void * /* user_data */) {
        if (level >= GGML_LOG_LEVEL_ERROR) {
            fprintf(stderr, "%s", text);
        }
    }, nullptr);

    // load dynamic backends
    ggml_backend_load_all();

    // initialize the model
    llama_model_params model_params = llama_model_default_params();
    model_params.n_gpu_layers = ngl;

    llama_model * model = llama_model_load_from_file(model_path.c_str(), model_params);
    if (!model) {
        fprintf(stderr , "%s: error: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context
    llama_context_params ctx_params = llama_context_default_params();
    ctx_params.n_ctx = n_ctx;
    ctx_params.n_batch = n_ctx;

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr , "%s: error: failed to create the llama_context\n" , __func__);
        return 1;
    }

    // initialize the sampler
    llama_sampler * smpl = llama_sampler_chain_init(llama_sampler_chain_default_params());
    llama_sampler_chain_add(smpl, llama_sampler_init_min_p(0.05f, 1));
    llama_sampler_chain_add(smpl, llama_sampler_init_temp(0.8f));
    llama_sampler_chain_add(smpl, llama_sampler_init_dist(LLAMA_DEFAULT_SEED));

    // helper function to evaluate a prompt and generate a response
    auto generate = [&](const std::string & prompt) {
        std::string response;

        const bool is_first = llama_kv_self_used_cells(ctx) == 0;

        // tokenize the prompt
        const int n_prompt_tokens = -llama_tokenize(vocab, prompt.c_str(), prompt.size(), NULL, 0, is_first, true);
        std::vector<llama_token> prompt_tokens(n_prompt_tokens);
        if (llama_tokenize(vocab, prompt.c_str(), prompt.size(), prompt_tokens.data(), prompt_tokens.size(), is_first, true) < 0) {
            GGML_ABORT("failed to tokenize the prompt\n");
        }

        // prepare a batch for the prompt
        llama_batch batch = llama_batch_get_one(prompt_tokens.data(), prompt_tokens.size());
        llama_token new_token_id;
        while (true) {
            // check if we have enough space in the context to evaluate this batch
            int n_ctx = llama_n_ctx(ctx);
            int n_ctx_used = llama_kv_self_used_cells(ctx);
            if (n_ctx_used + batch.n_tokens > n_ctx) {
                printf("\033[0m\n");
                fprintf(stderr, "context size exceeded\n");
                exit(0);
            }

            if (llama_decode(ctx, batch)) {
                GGML_ABORT("failed to decode\n");
            }

            // sample the next token
            new_token_id = llama_sampler_sample(smpl, ctx, -1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id)) {
                break;
            }

            // convert the token to a string, print it and add it to the response
            char buf[256];
            int n = llama_token_to_piece(vocab, new_token_id, buf, sizeof(buf), 0, true);
            if (n < 0) {
                GGML_ABORT("failed to convert token to piece\n");
            }
            std::string piece(buf, n);
            printf("%s", piece.c_str());
            fflush(stdout);
            response += piece;

            // prepare the next batch with the sampled token
            batch = llama_batch_get_one(&new_token_id, 1);
        }

        return response;
    };

    std::vector<llama_chat_message> messages;
    std::vector<char> formatted(llama_n_ctx(ctx));
    int prev_len = 0;
    while (true) {
        // get user input
        printf("\033[32m> \033[0m");
        std::string user;
        std::getline(std::cin, user);

        if (user.empty()) {
            break;
        }

        const char * tmpl = llama_model_chat_template(model, /* name */ nullptr);

        // add the user input to the message list and format it
        messages.push_back({"user", strdup(user.c_str())});
        int new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        if (new_len > (int)formatted.size()) {
            formatted.resize(new_len);
            new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        }
        if (new_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }

        // remove previous messages to obtain the prompt to generate the response
        std::string prompt(formatted.begin() + prev_len, formatted.begin() + new_len);

        // generate a response
        printf("\033[33m");
        std::string response = generate(prompt);
        printf("\n\033[0m");

        // add the response to the messages
        messages.push_back({"assistant", strdup(response.c_str())});
        prev_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), false, nullptr, 0);
        if (prev_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }
    }

    // free resources
    for (auto & msg : messages) {
        free(const_cast<char *>(msg.content));
    }
    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}